

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O1

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprGuardToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult)

{
  Expr *pEVar1;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_20;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_18;
  
  pEVar1 = (guardResult->_M_t).
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1->_vptr_Expr == (_func_int **)&PTR__BiOpExpr_00128998) {
    local_20._M_head_impl = (Expr *)pEVar1[1].lexer;
    pEVar1[1].lexer = (Lexer *)0x0;
    local_18._M_head_impl = *(Expr **)&pEVar1[1].type;
    *(undefined8 *)&pEVar1[1].type = 0;
    fromExprDeclToFunctionParam
              (this,expr,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_20
               ,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_18);
    if (local_18._M_head_impl != (Expr *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Expr[1])();
    }
    if ((Lexer *)local_20._M_head_impl != (Lexer *)0x0) {
      (*(local_20._M_head_impl)->_vptr_Expr[1])();
    }
    return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
              )this;
  }
  __cxa_bad_cast();
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprGuardToFunctionParam(
    std::unique_ptr<Expr> &&expr, std::unique_ptr<Expr> &&guardResult) noexcept {
  BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*expr);
  return fromExprDeclToFunctionParam(biopexpr.getLeftPtr(),
    biopexpr.getRightPtr(), std::move(guardResult));
}